

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strscan.c
# Opt level: O0

StrScanFmt
strscan_hex(uint8_t *p,TValue *o,StrScanFmt fmt,uint32_t opt,int32_t ex2,int32_t neg,uint32_t dig)

{
  byte bVar1;
  uint in_ECX;
  StrScanFmt in_EDX;
  ulong *in_RSI;
  byte *in_RDI;
  int in_R9D;
  uint in_stack_00000008;
  uint32_t d;
  uint32_t i;
  uint64_t x;
  ulong local_58;
  int local_50;
  int local_4c;
  uint in_stack_ffffffffffffffc0;
  uint ex2_00;
  uint in_stack_ffffffffffffffc8;
  uint uVar2;
  StrScanFmt local_1c;
  byte *local_10;
  
  local_58 = 0;
  uVar2 = in_stack_00000008;
  local_10 = in_RDI;
  ex2_00 = in_stack_00000008;
  if (0x10 < in_stack_00000008) {
    uVar2 = 0x10;
    ex2_00 = 0x10;
  }
  for (; uVar2 != 0; uVar2 = uVar2 - 1) {
    if (*local_10 == 0x2e) {
      bVar1 = local_10[1];
      local_10 = local_10 + 1;
    }
    else {
      bVar1 = *local_10;
    }
    in_stack_ffffffffffffffc0 = (uint)bVar1;
    in_stack_ffffffffffffffc8 = in_stack_ffffffffffffffc0;
    if (0x39 < in_stack_ffffffffffffffc0) {
      in_stack_ffffffffffffffc8 = in_stack_ffffffffffffffc0 + 9;
    }
    local_58 = local_58 * 0x10 + (ulong)(in_stack_ffffffffffffffc8 & 0xf);
    local_10 = local_10 + 1;
  }
  for (uVar2 = 0x10; uVar2 < in_stack_00000008; uVar2 = uVar2 + 1) {
    if (*local_10 == 0x2e) {
      bVar1 = local_10[1];
      local_10 = local_10 + 1;
    }
    else {
      bVar1 = *local_10;
    }
    local_58 = (long)(int)(uint)(bVar1 != 0x30) | local_58;
    local_10 = local_10 + 1;
  }
  local_50 = (int)local_58;
  if (in_EDX == STRSCAN_INT) {
    if (((in_ECX & 2) == 0) && (local_58 < in_R9D + 0x80000000)) {
      local_4c = local_50;
      if (in_R9D != 0) {
        local_4c = -local_50;
      }
      *(int *)in_RSI = local_4c;
      return STRSCAN_INT;
    }
    if ((in_ECX & 0x10) != 0) goto LAB_001221d0;
    local_1c = STRSCAN_NUM;
  }
  else {
    if (in_EDX == STRSCAN_U32) {
LAB_001221d0:
      if (8 < in_stack_00000008) {
        return STRSCAN_ERROR;
      }
      if (in_R9D != 0) {
        local_50 = -local_50;
      }
      *(int *)in_RSI = local_50;
      return STRSCAN_U32;
    }
    local_1c = in_EDX;
    if (in_EDX - STRSCAN_I64 < 2) {
      if (0x10 < in_stack_00000008) {
        return STRSCAN_ERROR;
      }
      if (in_R9D != 0) {
        local_58 = -local_58;
      }
      *in_RSI = local_58;
      return in_EDX;
    }
  }
  if ((local_58 & 0xc000000000000000) != 0) {
    local_58 = local_58 >> 2 | local_58 & 3;
  }
  strscan_double(local_58,(TValue *)CONCAT44(uVar2,in_stack_ffffffffffffffc8),ex2_00,
                 in_stack_ffffffffffffffc0);
  return local_1c;
}

Assistant:

static StrScanFmt strscan_hex(const uint8_t *p, TValue *o,
			      StrScanFmt fmt, uint32_t opt,
			      int32_t ex2, int32_t neg, uint32_t dig)
{
  uint64_t x = 0;
  uint32_t i;

  /* Scan hex digits. */
  for (i = dig > 16 ? 16 : dig ; i; i--, p++) {
    uint32_t d = (*p != '.' ? *p : *++p); if (d > '9') d += 9;
    x = (x << 4) + (d & 15);
  }

  /* Summarize rounding-effect of excess digits. */
  for (i = 16; i < dig; i++, p++)
    x |= ((*p != '.' ? *p : *++p) != '0'), ex2 += 4;

  /* Format-specific handling. */
  switch (fmt) {
  case STRSCAN_INT:
    if (!(opt & STRSCAN_OPT_TONUM) && x < 0x80000000u+neg) {
      o->i = neg ? -(int32_t)x : (int32_t)x;
      return STRSCAN_INT;  /* Fast path for 32 bit integers. */
    }
    if (!(opt & STRSCAN_OPT_C)) { fmt = STRSCAN_NUM; break; }
    /* fallthrough */
  case STRSCAN_U32:
    if (dig > 8) return STRSCAN_ERROR;
    o->i = neg ? -(int32_t)x : (int32_t)x;
    return STRSCAN_U32;
  case STRSCAN_I64:
  case STRSCAN_U64:
    if (dig > 16) return STRSCAN_ERROR;
    o->u64 = neg ? (uint64_t)-(int64_t)x : x;
    return fmt;
  default:
    break;
  }

  /* Reduce range then convert to double. */
  if ((x & U64x(c0000000,0000000))) { x = (x >> 2) | (x & 3); ex2 += 2; }
  strscan_double(x, o, ex2, neg);
  return fmt;
}